

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint8_t __thiscall Cache::getByte(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  uint32_t uVar3;
  uint uVar4;
  pointer pBVar5;
  uint32_t uVar6;
  uint uVar7;
  pointer pBVar8;
  
  this->referenceCounter = this->referenceCounter + 1;
  (this->statistics).numRead = (this->statistics).numRead + 1;
  uVar6 = getBlockId(this,addr);
  if (uVar6 == 0xffffffff) {
    puVar1 = &(this->statistics).numMiss;
    *puVar1 = *puVar1 + 1;
    puVar2 = &(this->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)(this->policy).missLatency;
    loadBlockFromLowerLevel(this,addr,cycles);
    uVar6 = getBlockId(this,addr);
    if (uVar6 == 0xffffffff) {
      fwrite("Error: data not in top level cache!\n",0x24,1,_stderr);
      exit(-1);
    }
    uVar7 = getOffset(this,addr);
    pBVar5 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar8 = pBVar5 + (int)uVar6;
    pBVar5[(int)uVar6].lastReference = this->referenceCounter;
  }
  else {
    uVar7 = getOffset(this,addr);
    puVar1 = &(this->statistics).numHit;
    *puVar1 = *puVar1 + 1;
    uVar3 = this->referenceCounter;
    uVar4 = (this->policy).hitLatency;
    puVar2 = &(this->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)uVar4;
    pBVar5 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar8 = pBVar5 + (int)uVar6;
    pBVar5[(int)uVar6].lastReference = uVar3;
    if (cycles != (uint32_t *)0x0) {
      *cycles = uVar4;
    }
  }
  return *(uint8_t *)
          (*(long *)&(pBVar8->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + (ulong)uVar7);
}

Assistant:

uint8_t Cache::getByte(uint32_t addr, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numRead++;

  // If in cache, return directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].lastReference = this->referenceCounter;
    if (cycles) *cycles = this->policy.hitLatency;
    return this->blocks[blockId].data[offset];
  }

  // Else, find the data in memory or other level of cache
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;
  this->loadBlockFromLowerLevel(addr, cycles);

  // The block is in top level cache now, return directly
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->blocks[blockId].lastReference = this->referenceCounter;
    return this->blocks[blockId].data[offset];
  } else {
    fprintf(stderr, "Error: data not in top level cache!\n");
    exit(-1);
  }
}